

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::createDefinition
          (Compilation *this,Scope *scope,LookupLocation location,ModuleDeclarationSyntax *syntax)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  ulong uVar4;
  DefinitionSymbol *pDVar5;
  value_type_pointer ppVar6;
  RootSymbol *pRVar7;
  uint uVar8;
  int iVar9;
  undefined1 auVar10 [16];
  _Optional_payload_base<slang::TimeScale> timeScale;
  byte bVar11;
  undefined8 uVar12;
  NetType *__args_4;
  reference pvVar13;
  ulong uVar14;
  uint uVar15;
  ModuleDeclarationSyntax *pMVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  value_type_pointer ppVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  byte bVar26;
  SourceRange sourceRange;
  try_emplace_args_t local_c1;
  ulong local_c0;
  pointer def;
  ModuleDeclarationSyntax *local_b0;
  ModuleDeclarationSyntax *local_a8;
  ulong local_a0;
  undefined1 local_98 [32];
  LookupLocation location_local;
  
  location_local.scope = location.scope;
  location_local.index = location.index;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = syntax;
  local_c0 = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar14 = local_c0 >>
           ((byte)(this->syntaxMetadata).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                  .arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[local_c0 & 0xff];
  ppVar20 = (this->syntaxMetadata).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
            .arrays.elements_;
  local_a0 = (ulong)((uint)local_c0 & 7);
  uVar4 = (this->syntaxMetadata).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
          .arrays.groups_size_mask;
  uVar17 = 0;
  uVar19 = uVar14;
  do {
    pgVar1 = (this->syntaxMetadata).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
             .arrays.groups_ + uVar19;
    bVar11 = pgVar1->m[0xf].n;
    uVar23 = (uchar)uVar3;
    auVar21[0] = -(pgVar1->m[0].n == uVar23);
    uVar24 = (uchar)((uint)uVar3 >> 8);
    auVar21[1] = -(pgVar1->m[1].n == uVar24);
    uVar25 = (uchar)((uint)uVar3 >> 0x10);
    auVar21[2] = -(pgVar1->m[2].n == uVar25);
    bVar26 = (byte)((uint)uVar3 >> 0x18);
    auVar21[3] = -(pgVar1->m[3].n == bVar26);
    auVar21[4] = -(pgVar1->m[4].n == uVar23);
    auVar21[5] = -(pgVar1->m[5].n == uVar24);
    auVar21[6] = -(pgVar1->m[6].n == uVar25);
    auVar21[7] = -(pgVar1->m[7].n == bVar26);
    auVar21[8] = -(pgVar1->m[8].n == uVar23);
    auVar21[9] = -(pgVar1->m[9].n == uVar24);
    auVar21[10] = -(pgVar1->m[10].n == uVar25);
    auVar21[0xb] = -(pgVar1->m[0xb].n == bVar26);
    auVar21[0xc] = -(pgVar1->m[0xc].n == uVar23);
    auVar21[0xd] = -(pgVar1->m[0xd].n == uVar24);
    auVar21[0xe] = -(pgVar1->m[0xe].n == uVar25);
    auVar21[0xf] = -(bVar11 == bVar26);
    for (uVar15 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
        def = (pointer)syntax, local_a8 = syntax, uVar15 != 0; uVar15 = uVar15 - 1 & uVar15) {
      uVar8 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      if ((ModuleDeclarationSyntax *)ppVar20[uVar19 * 0xf + (ulong)uVar8].first == syntax) {
        ppVar20 = ppVar20 + uVar19 * 0xf + (ulong)uVar8;
        goto LAB_00256959;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[local_a0] & bVar11) == 0) break;
    lVar18 = uVar19 + uVar17;
    uVar17 = uVar17 + 1;
    uVar19 = lVar18 + 1U & uVar4;
  } while (uVar17 <= uVar4);
  if ((this->syntaxMetadata).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
      .size_ctrl.size <
      (this->syntaxMetadata).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              ((locator *)local_98,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                *)&this->syntaxMetadata,uVar14,local_c0,(try_emplace_args_t *)&local_b0,
               (SyntaxNode **)&def);
    ppVar20 = (value_type_pointer)local_98._16_8_;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              ((locator *)local_98,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                *)&this->syntaxMetadata,local_c0,(try_emplace_args_t *)&local_b0,(SyntaxNode **)&def
              );
    ppVar20 = (value_type_pointer)local_98._16_8_;
  }
LAB_00256959:
  __args_4 = (ppVar20->second).defaultNetType;
  if (__args_4 == (NetType *)0x0) {
    __args_4 = Scope::getDefaultNetType(scope);
    (ppVar20->second).defaultNetType = __args_4;
  }
  pMVar16 = local_a8;
  local_98._24_8_ = scope;
  std::
  make_unique<slang::ast::DefinitionSymbol,slang::ast::Scope_const&,slang::ast::LookupLocation&,slang::syntax::ModuleDeclarationSyntax_const&,slang::ast::NetType_const&,slang::ast::UnconnectedDrive&,bool&,std::optional<slang::TimeScale>&,slang::syntax::SyntaxTree_const*&>
            ((Scope *)local_98,(LookupLocation *)scope,(ModuleDeclarationSyntax *)&location_local,
             (NetType *)local_a8,(UnconnectedDrive *)__args_4,
             (bool *)&(ppVar20->second).unconnectedDrive,
             (optional<slang::TimeScale> *)&(ppVar20->second).cellDefine,
             (SyntaxTree **)&(ppVar20->second).timeScale);
  pvVar13 = std::
            vector<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>,std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>>>
            ::
            emplace_back<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>>
                      ((vector<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>,std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>>>
                        *)&this->definitionMemory,
                       (unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
                        *)local_98);
  pDVar5 = (pvVar13->_M_t).
           super___uniq_ptr_impl<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::DefinitionSymbol_*,_std::default_delete<slang::ast::DefinitionSymbol>_>
           .super__Head_base<0UL,_slang::ast::DefinitionSymbol_*,_false>._M_head_impl;
  std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
  ::~unique_ptr((unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
                 *)local_98);
  local_b0 = pMVar16;
  uVar14 = local_c0 >>
           ((byte)(this->definitionFromSyntax).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar6 = (this->definitionFromSyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
           .arrays.elements_;
  uVar4 = (this->definitionFromSyntax).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
          .arrays.groups_size_mask;
  uVar17 = 0;
  uVar19 = uVar14;
  do {
    pgVar2 = (this->definitionFromSyntax).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
             .arrays.groups_ + uVar19;
    bVar11 = pgVar2->m[0xf].n;
    auVar22[0] = -(pgVar2->m[0].n == uVar23);
    auVar22[1] = -(pgVar2->m[1].n == uVar24);
    auVar22[2] = -(pgVar2->m[2].n == uVar25);
    auVar22[3] = -(pgVar2->m[3].n == bVar26);
    auVar22[4] = -(pgVar2->m[4].n == uVar23);
    auVar22[5] = -(pgVar2->m[5].n == uVar24);
    auVar22[6] = -(pgVar2->m[6].n == uVar25);
    auVar22[7] = -(pgVar2->m[7].n == bVar26);
    auVar22[8] = -(pgVar2->m[8].n == uVar23);
    auVar22[9] = -(pgVar2->m[9].n == uVar24);
    auVar22[10] = -(pgVar2->m[10].n == uVar25);
    auVar22[0xb] = -(pgVar2->m[0xb].n == bVar26);
    auVar22[0xc] = -(pgVar2->m[0xc].n == uVar23);
    auVar22[0xd] = -(pgVar2->m[0xd].n == uVar24);
    auVar22[0xe] = -(pgVar2->m[0xe].n == uVar25);
    auVar22[0xf] = -(bVar11 == bVar26);
    for (uVar15 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe); def = pDVar5,
        uVar15 != 0; uVar15 = uVar15 - 1 & uVar15) {
      iVar9 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
        }
      }
      if (*(ModuleDeclarationSyntax **)
           ((long)&ppVar6[uVar19 * 0xf].first + (ulong)(uint)(iVar9 << 5)) == pMVar16) {
        local_98._16_8_ = (long)&ppVar6[uVar19 * 0xf].first + (ulong)(uint)(iVar9 << 5);
        goto LAB_00256ac8;
      }
      pMVar16 = local_a8;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[local_a0] & bVar11) == 0) break;
    lVar18 = uVar19 + uVar17;
    uVar17 = uVar17 + 1;
    uVar19 = lVar18 + 1U & uVar4;
  } while (uVar17 <= uVar4);
  if ((this->definitionFromSyntax).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
      .size_ctrl.size <
      (this->definitionFromSyntax).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::ModuleDeclarationSyntax_const*,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::ModuleDeclarationSyntax_const*,void>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*const,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::ModuleDeclarationSyntax_const*>
              ((locator *)local_98,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::ModuleDeclarationSyntax_const*,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::ModuleDeclarationSyntax_const*,void>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*const,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>>>
                *)&this->definitionFromSyntax,uVar14,local_c0,&local_c1,&local_b0);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::ModuleDeclarationSyntax_const*,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::ModuleDeclarationSyntax_const*,void>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*const,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::ModuleDeclarationSyntax_const*>
              ((locator *)local_98,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::ModuleDeclarationSyntax_const*,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::ModuleDeclarationSyntax_const*,void>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*const,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>>>
                *)&this->definitionFromSyntax,local_c0,&local_c1,&local_b0);
  }
LAB_00256ac8:
  std::vector<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>::
  push_back((vector<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>
             *)&((value_type_pointer)local_98._16_8_)->second,&def);
  uVar12 = local_98._24_8_;
  insertDefinition(this,&def->super_Symbol,(Scope *)local_98._24_8_);
  pRVar7 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  if ((((Symbol *)((string_view *)(uVar12 + 8))->_M_len)->kind == CompilationUnit) ||
     (pRVar7 != (RootSymbol *)0x0 && &pRVar7->super_Scope == (Scope *)uVar12)) {
    timeScale = (def->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScale>;
    sourceRange = parsing::Token::range
                            (&((not_null<slang::syntax::ModuleHeaderSyntax_*> *)
                              ((long)pMVar16 + 0x50))->ptr->name);
    checkElemTimeScale(this,(optional<slang::TimeScale>)timeScale,sourceRange);
  }
  return;
}

Assistant:

void Compilation::createDefinition(const Scope& scope, LookupLocation location,
                                   const ModuleDeclarationSyntax& syntax) {
    SLANG_ASSERT(!isFrozen());

    // We can only be missing metadata if the definition is created programmatically
    // (i.e. not via the parser) so we just fill in the parent's default net type
    // so that it's not a null pointer.
    auto& metadata = syntaxMetadata[&syntax];
    if (!metadata.defaultNetType)
        metadata.defaultNetType = &scope.getDefaultNetType();

    auto def = definitionMemory
                   .emplace_back(std::make_unique<DefinitionSymbol>(
                       scope, location, syntax, *metadata.defaultNetType, metadata.unconnectedDrive,
                       metadata.cellDefine, metadata.timeScale, metadata.tree))
                   .get();
    definitionFromSyntax[&syntax].push_back(def);

    insertDefinition(*def, scope);

    auto targetScope = scope.asSymbol().kind == SymbolKind::CompilationUnit ? root.get() : &scope;
    const bool isRoot = targetScope == root.get();
    if (isRoot)
        checkElemTimeScale(def->timeScale, syntax.header->name.range());
}